

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferMalloc.cpp
# Opt level: O0

void __thiscall adios2::format::BufferMalloc::Resize(BufferMalloc *this,size_t size,string *hint)

{
  void *pvVar1;
  size_t in_RSI;
  unsigned_long in_RDI;
  char *tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_220 [4];
  int in_stack_fffffffffffffde4;
  string *in_stack_fffffffffffffde8;
  string *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe00;
  string local_1e0 [32];
  string local_1c0 [39];
  undefined1 local_199 [40];
  undefined1 local_171 [40];
  allocator local_149;
  string local_148 [32];
  void *local_128;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [40];
  size_t local_10;
  
  if (in_RSI != 0) {
    local_10 = in_RSI;
    if (*(long *)(in_RDI + 0x40) == 0) {
      pvVar1 = malloc(in_RSI);
      *(void **)(in_RDI + 0x48) = pvVar1;
      if (*(long *)(in_RDI + 0x48) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_38,"Toolkit::Format",&local_39);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,"buffer::heap::BufferMalloc",&local_71);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_98,"BufferSystemV",&local_99);
        std::__cxx11::to_string(in_RDI);
        std::operator+((char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        std::operator+(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
        std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        helper::ThrowNested<std::runtime_error>
                  (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                   in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
        std::__cxx11::string::~string(local_c0);
        std::__cxx11::string::~string(local_e0);
        std::__cxx11::string::~string(local_100);
        std::__cxx11::string::~string(local_120);
        std::__cxx11::string::~string(local_98);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
        std::__cxx11::string::~string(local_38);
        std::allocator<char>::~allocator((allocator<char> *)&local_39);
      }
    }
    else {
      local_128 = realloc(*(void **)(in_RDI + 0x48),in_RSI);
      if (local_128 == (void *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_148,"Toolkit::Format",&local_149);
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_171;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_171 + 1),"buffer::heap::BufferMalloc",(allocator *)__lhs);
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_199;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)(local_199 + 1),"BufferSystemV",(allocator *)__rhs);
        std::__cxx11::to_string(in_RDI);
        std::operator+((char *)__lhs,__rhs);
        std::operator+(__lhs,(char *)__rhs);
        std::operator+(__lhs,__rhs);
        helper::ThrowNested<std::runtime_error>
                  (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                   in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
        std::__cxx11::string::~string(local_1c0);
        std::__cxx11::string::~string(local_1e0);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
        std::__cxx11::string::~string(local_220);
        std::__cxx11::string::~string((string *)(local_199 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_199);
        std::__cxx11::string::~string((string *)(local_171 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_171);
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
      }
      *(void **)(in_RDI + 0x48) = local_128;
    }
    *(size_t *)(in_RDI + 0x40) = local_10;
  }
  return;
}

Assistant:

void BufferMalloc::Resize(const size_t size, const std::string hint)
{
    if (size == 0)
        return;
    if (m_size == 0)
    {
        m_buffer = (char *)malloc(size);
        if (m_buffer == NULL)
            helper::ThrowNested<std::runtime_error>(
                "Toolkit::Format", "buffer::heap::BufferMalloc", "BufferSystemV",
                "buffer overflow when resizing to " + std::to_string(size) + " bytes, " + hint);
    }
    else
    {
        char *tmp = (char *)realloc(m_buffer, size);
        if (tmp == NULL)
            helper::ThrowNested<std::runtime_error>(
                "Toolkit::Format", "buffer::heap::BufferMalloc", "BufferSystemV",
                "buffer overflow when resizing to " + std::to_string(size) + " bytes, " + hint);
        m_buffer = tmp;
    }
    m_size = size;
}